

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_estimateSubBlockSize_symbolType
                 (symbolEncodingType_e type,BYTE *codeTable,uint maxCode,size_t nbSeq,
                 FSE_CTable *fseCTable,U32 *additionalBits,short *defaultNorm,U32 defaultNormLog,
                 void *workspace,size_t wkspSize)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  uint max;
  uint local_34;
  
  local_34 = maxCode;
  HIST_countFast_wksp((uint *)workspace,&local_34,codeTable,nbSeq,workspace,0x1800);
  if (type != set_rle) {
    if (type == set_basic) {
      uVar1 = ZSTD_crossEntropyCost(defaultNorm,defaultNormLog,(uint *)workspace,local_34);
      goto LAB_0015419b;
    }
    if ((type & ~set_rle) == set_compressed) {
      uVar1 = ZSTD_fseBitCost(fseCTable,(uint *)workspace,local_34);
      if (0xffffffffffffff88 < uVar1) {
        return nbSeq * 10;
      }
      goto LAB_0015419b;
    }
  }
  uVar1 = 0;
LAB_0015419b:
  pbVar3 = codeTable + nbSeq;
  for (; codeTable < pbVar3; codeTable = codeTable + 1) {
    uVar2 = (ulong)*codeTable;
    if (additionalBits != (U32 *)0x0) {
      uVar2 = (ulong)additionalBits[uVar2];
    }
    uVar1 = uVar1 + uVar2;
  }
  return uVar1 >> 3;
}

Assistant:

static size_t ZSTD_estimateSubBlockSize_symbolType(symbolEncodingType_e type,
                        const BYTE* codeTable, unsigned maxCode,
                        size_t nbSeq, const FSE_CTable* fseCTable,
                        const U32* additionalBits,
                        short const* defaultNorm, U32 defaultNormLog,
                        void* workspace, size_t wkspSize)
{
    unsigned* const countWksp = (unsigned*)workspace;
    const BYTE* ctp = codeTable;
    const BYTE* const ctStart = ctp;
    const BYTE* const ctEnd = ctStart + nbSeq;
    size_t cSymbolTypeSizeEstimateInBits = 0;
    unsigned max = maxCode;

    HIST_countFast_wksp(countWksp, &max, codeTable, nbSeq, workspace, wkspSize);  /* can't fail */
    if (type == set_basic) {
        cSymbolTypeSizeEstimateInBits = ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, countWksp, max);
    } else if (type == set_rle) {
        cSymbolTypeSizeEstimateInBits = 0;
    } else if (type == set_compressed || type == set_repeat) {
        cSymbolTypeSizeEstimateInBits = ZSTD_fseBitCost(fseCTable, countWksp, max);
    }
    if (ZSTD_isError(cSymbolTypeSizeEstimateInBits)) return nbSeq * 10;
    while (ctp < ctEnd) {
        if (additionalBits) cSymbolTypeSizeEstimateInBits += additionalBits[*ctp];
        else cSymbolTypeSizeEstimateInBits += *ctp; /* for offset, offset code is also the number of additional bits */
        ctp++;
    }
    return cSymbolTypeSizeEstimateInBits / 8;
}